

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestExtensionRangeSerialize::Clear(TestExtensionRangeSerialize *this)

{
  uint32_t *puVar1;
  uint32_t cached_has_bits;
  TestExtensionRangeSerialize *this_local;
  
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 0xf) != 0) {
    memset((void *)((long)&this->field_0 + 0x20),0,0x10);
  }
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestExtensionRangeSerialize::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestExtensionRangeSerialize)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    ::memset(&_impl_.foo_one_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.foo_four_) -
        reinterpret_cast<char*>(&_impl_.foo_one_)) + sizeof(_impl_.foo_four_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}